

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cc
# Opt level: O0

void bloaty::DisassembleFindReferences(DisassemblyInfo *info,RangeSink *sink)

{
  int iVar1;
  _Bool _Var2;
  cs_err cVar3;
  size_type sVar4;
  cs_insn *pcVar5;
  csh *pcVar6;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  uint64_t to_address;
  cs_x86_op *op;
  size_t i;
  size_t count;
  size_t size;
  uint8_t *ptr;
  uint64_t address;
  cs_insn *in;
  csh handle;
  uint64_t in_stack_000000f0;
  uint64_t in_stack_000000f8;
  uint64_t in_stack_00000100;
  char *in_stack_00000108;
  RangeSink *in_stack_00000110;
  cs_insn *in_stack_00000528;
  uint64_t *in_stack_00000530;
  size_t *in_stack_00000538;
  uint8_t **in_stack_00000540;
  csh in_stack_00000548;
  size_t in_stack_ffffffffffffffa8;
  cs_insn *in_stack_ffffffffffffffb0;
  csh *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffd8;
  char *pcVar7;
  undefined8 in_stack_ffffffffffffffe0;
  cs_opt_type type;
  csh in_stack_ffffffffffffffe8;
  
  type = (cs_opt_type)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  if ((int)in_RDI[7]._M_len == 3) {
    cVar3 = cs_open((cs_arch)in_stack_ffffffffffffffc0,
                    (cs_mode)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                    (csh *)in_stack_ffffffffffffffb0);
    if ((cVar3 != CS_ERR_OK) ||
       (cVar3 = cs_option(in_stack_ffffffffffffffe8,type,in_stack_ffffffffffffffd8),
       cVar3 != CS_ERR_OK)) {
      Throw(in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    }
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size(in_RDI);
    if (sVar4 == 0) {
      cs_close(in_stack_ffffffffffffffb8);
      Throw(in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    }
    pcVar5 = cs_malloc((csh)in_stack_ffffffffffffffb8);
    pcVar7 = in_RDI[7]._M_str;
    std::basic_string_view<char,_std::char_traits<char>_>::data(in_RDI);
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size(in_RDI);
    while (sVar4 != 0) {
      _Var2 = cs_disasm_iter(in_stack_00000548,in_stack_00000540,in_stack_00000538,in_stack_00000530
                             ,in_stack_00000528);
      if (!_Var2) {
        if (1 < verbose_level) {
          printf("Error disassembling function at address: %lx\n",pcVar7);
        }
        break;
      }
      pcVar6 = (csh *)(ulong)(pcVar5->detail->field_6).x86.op_count;
      for (in_stack_ffffffffffffffb8 = (csh *)0x0; in_stack_ffffffffffffffb8 < pcVar6;
          in_stack_ffffffffffffffb8 = (csh *)((long)in_stack_ffffffffffffffb8 + 1)) {
        in_stack_ffffffffffffffb0 =
             (cs_insn *)(pcVar5->detail->groups + (long)in_stack_ffffffffffffffb8 * 0x30 + 0x55);
        if ((((in_stack_ffffffffffffffb0->id == 3) &&
             (*(int *)((long)&in_stack_ffffffffffffffb0->address + 4) == 0x29)) &&
            ((int)in_stack_ffffffffffffffb0->address == 0)) &&
           ((iVar1._0_2_ = in_stack_ffffffffffffffb0->size,
            iVar1._2_1_ = in_stack_ffffffffffffffb0->bytes[0],
            iVar1._3_1_ = in_stack_ffffffffffffffb0->bytes[1], iVar1 == 0 &&
            (in_stack_ffffffffffffffa8 =
                  pcVar5->address + (ulong)pcVar5->size +
                  *(long *)(in_stack_ffffffffffffffb0->bytes + 6), in_stack_ffffffffffffffa8 != 0)))
           ) {
          RangeSink::AddVMRangeForVMAddr
                    (in_stack_00000110,in_stack_00000108,in_stack_00000100,in_stack_000000f8,
                     in_stack_000000f0);
        }
      }
    }
    cs_free(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    cs_close(in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

void DisassembleFindReferences(const DisassemblyInfo& info, RangeSink* sink) {
  if (info.arch != CS_ARCH_X86) {
    // x86 only for now.
    return;
  }

  csh handle;
  if (cs_open(info.arch, info.mode, &handle) != CS_ERR_OK ||
      cs_option(handle, CS_OPT_DETAIL, CS_OPT_ON) != CS_ERR_OK) {
    THROW("Couldn't initialize Capstone");
  }

  if (info.text.size() == 0) {
    cs_close(&handle);
    THROW("Tried to disassemble empty function.");
  }

  cs_insn *in = cs_malloc(handle);
  uint64_t address = info.start_address;
  const uint8_t* ptr = reinterpret_cast<const uint8_t*>(info.text.data());
  size_t size = info.text.size();

  while (size > 0) {
    if (!cs_disasm_iter(handle, &ptr, &size, &address, in)) {
      // Some symbols that end up in the .text section aren't really functions
      // but data.  Not sure why this happens.
      if (verbose_level > 1) {
        printf("Error disassembling function at address: %" PRIx64 "\n",
               address);
      }
      goto cleanup;
    }

    size_t count = in->detail->x86.op_count;
    for (size_t i = 0; i < count; i++) {
      cs_x86_op* op = &in->detail->x86.operands[i];
      if (op->type == X86_OP_MEM && op->mem.base == X86_REG_RIP &&
          op->mem.segment == X86_REG_INVALID &&
          op->mem.index == X86_REG_INVALID) {
        uint64_t to_address = in->address + in->size + op->mem.disp;
        if (to_address) {
          sink->AddVMRangeForVMAddr("x86_disassemble", in->address, to_address,
                                    RangeSink::kUnknownSize);
        }
      }
    }
  }

cleanup:
  cs_free(in, 1);
  cs_close(&handle);
}